

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

QByteArray * QTimeZonePrivate::windowsIdToDefaultIanaId(QByteArray *windowsId)

{
  long lVar1;
  WindowsData *ba;
  QByteArrayView *pQVar2;
  QByteArrayView *pQVar3;
  WindowsData *in_RSI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  WindowsData *data;
  QByteArrayView id;
  QByteArrayView *lhs;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  bool bVar4;
  QByteArray *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = in_RDI;
  pQVar2 = in_RDI;
  ba = std::begin<QtTimeZoneCldr::WindowsData_const,139ul>
                 ((WindowsData (*) [139])&QtTimeZoneCldr::windowsDataTable);
  std::end<QtTimeZoneCldr::WindowsData_const,139ul>
            ((WindowsData (*) [139])&QtTimeZoneCldr::windowsDataTable);
  pQVar2 = (QByteArrayView *)
           std::
           lower_bound<QtTimeZoneCldr::WindowsData_const*,QByteArray,bool(*)(QtTimeZoneCldr::WindowsData,QByteArrayView)noexcept>
                     ((WindowsData *)pQVar2,in_RSI,in_stack_ffffffffffffffb0,
                      (_func_bool_WindowsData_QByteArrayView *)
                      CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  pQVar3 = (QByteArrayView *)
           std::end<QtTimeZoneCldr::WindowsData_const,139ul>
                     ((WindowsData (*) [139])&QtTimeZoneCldr::windowsDataTable);
  bVar4 = false;
  if (pQVar2 != pQVar3) {
    QtTimeZoneCldr::WindowsData::windowsId((WindowsData *)lhs);
    QByteArrayView::QByteArrayView<QByteArray,_true>(pQVar2,(QByteArray *)ba);
    bVar4 = ::operator==(lhs,in_RDI);
  }
  if (bVar4 == false) {
    QByteArray::QByteArray((QByteArray *)0x73b5c5);
  }
  else {
    QtTimeZoneCldr::WindowsData::ianaId((WindowsData *)lhs);
    QByteArrayView::toByteArray(lhs);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QByteArray *)lhs;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QTimeZonePrivate::windowsIdToDefaultIanaId(const QByteArray &windowsId)
{
    const auto data = std::lower_bound(std::begin(windowsDataTable), std::end(windowsDataTable),
                                       windowsId, earlierWindowsId);
    if (data != std::end(windowsDataTable) && data->windowsId() == windowsId) {
        QByteArrayView id = data->ianaId();
        Q_ASSERT(id.indexOf(' ') == -1);
        return id.toByteArray();
    }
    return QByteArray();
}